

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O2

int __thiscall audiofft::OouraFFT::init(OouraFFT *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int nw;
  int extraout_EAX;
  undefined1 auVar1 [16];
  
  if ((EVP_PKEY_CTX *)this->_size == ctx) {
    return in_EAX;
  }
  auVar1._8_4_ = (int)((ulong)ctx >> 0x20);
  auVar1._0_8_ = ctx;
  auVar1._12_4_ = 0x45300000;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->_ip,
             (long)((int)SQRT((auVar1._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)ctx) - 4503599627370496.0)) + 2));
  std::vector<double,_std::allocator<double>_>::resize(&this->_w,(ulong)ctx >> 1);
  std::vector<double,_std::allocator<double>_>::resize(&this->_buffer,(size_type)ctx);
  this->_size = (size_t)ctx;
  nw = (int)((long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) / 4);
  makewt(this,nw,(this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
         (this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start);
  makect(this,nw,(this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
         (this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + nw);
  return extraout_EAX;
}

Assistant:

virtual void init(size_t size) override
        {
          if (_size != size)
          {
            _ip.resize(2 + static_cast<int>(std::sqrt(static_cast<double>(size))));
            _w.resize(size / 2);
            _buffer.resize(size);
            _size = size;

            const int size4 = static_cast<int>(_size) / 4;
            makewt(size4, _ip.data(), _w.data());
            makect(size4, _ip.data(), _w.data() + size4);
          }
        }